

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_size_format(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  char *zString;
  ulong uVar6;
  ulong uVar7;
  
  if (nArg < 1) {
    zString = "";
    iVar5 = 0;
  }
  else {
    uVar3 = jx9_value_to_int64(*apArg);
    if (99 < (long)uVar3) {
      iVar5 = 0;
      do {
        iVar2 = iVar5;
        uVar6 = uVar3;
        iVar5 = iVar2 + 1;
        uVar3 = uVar6 >> 10;
      } while (0xfffff < uVar6);
      uVar1 = (ushort)(((uint)uVar6 & 0x3fc) / 100);
      uVar4 = 9;
      if (uVar1 < 9) {
        uVar4 = uVar1;
      }
      uVar3 = (ulong)uVar4;
      if (0xf9fff < uVar6) {
        uVar3 = 9;
        iVar2 = iVar5;
      }
      uVar7 = uVar6 >> 10 & 0xffffffff;
      if (0xf9fff < uVar6) {
        uVar7 = 0;
      }
      jx9_result_string_format(pCtx,"%d.%d %cB",uVar7,uVar3,(ulong)(uint)(int)"KMGTPEZ"[iVar2]);
      return 0;
    }
    zString = "0.1 KB";
    iVar5 = 6;
  }
  jx9_result_string(pCtx,zString,iVar5);
  return 0;
}

Assistant:

static int jx9Builtin_size_format(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	/*Kilo*/ /*Mega*/ /*Giga*/ /*Tera*/ /*Peta*/ /*Exa*/ /*Zeta*/
	static const char zUnit[] = {"KMGTPEZ"};
	sxi32 nRest, i_32;
	jx9_int64 iSize;
	int c = -1; /* index in zUnit[] */

	if( nArg < 1 ){
		/* Missing argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the given size */
	iSize = jx9_value_to_int64(apArg[0]);
	if( iSize < 100 /* Bytes */ ){
		/* Don't bother formatting, return immediately */
		jx9_result_string(pCtx, "0.1 KB", (int)sizeof("0.1 KB")-1);
		return JX9_OK;
	}
	for(;;){
		nRest = (sxi32)(iSize & 0x3FF); 
		iSize >>= 10;
		c++;
		if( (iSize & (~0 ^ 1023)) == 0 ){
			break;
		}
	}
	nRest /= 100;
	if( nRest > 9 ){
		nRest = 9;
	}
	if( iSize > 999 ){
		c++;
		nRest = 9;
		iSize = 0;
	}
	i_32 = (sxi32)iSize;
	/* Format */
	jx9_result_string_format(pCtx, "%d.%d %cB", i_32, nRest, zUnit[c]);
	return JX9_OK;
}